

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log.cpp
# Opt level: O1

int main(void)

{
  _Atomic_word *p_Var1;
  char cVar2;
  level_type lVar3;
  int iVar4;
  file *pfVar5;
  shared_ptr *psVar6;
  ostream *poVar7;
  char *pcVar8;
  weak_ptr *pwVar9;
  long lVar10;
  runtime_error *prVar11;
  shared_ptr<booster::log::sink> s;
  ifstream ifs;
  shared_ptr<booster::log::sinks::file> f;
  string line;
  ostringstream oss_24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7b0;
  file *local_7a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_7a0;
  file local_798 [16];
  int aiStack_788 [122];
  file *local_5a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_598;
  undefined1 *local_590;
  undefined8 local_588;
  undefined1 local_580 [16];
  string local_570 [32];
  string local_550 [376];
  undefined1 *local_3d8 [2];
  undefined1 local_3c8 [16];
  message local_3b8 [48];
  message local_388 [48];
  message local_358 [48];
  message local_328 [48];
  message local_2f8 [48];
  message local_2c8 [48];
  message local_298 [48];
  message local_268 [48];
  message local_238 [48];
  message local_208 [48];
  message local_1d8 [48];
  message local_1a8 [48];
  message local_178 [48];
  message local_148 [48];
  message local_118 [48];
  message local_e8 [48];
  message local_b8 [48];
  message local_88 [48];
  message local_58 [48];
  
  pfVar5 = (file *)operator_new(8);
  ((sink *)&pfVar5->field_0x0)->_vptr_sink = (_func_int **)&PTR_log_0010abd0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<my_sink*>
            (&local_7b0,(my_sink *)pfVar5);
  psVar6 = (shared_ptr *)booster::log::logger::instance();
  booster::log::logger::add_sink(psVar6);
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x0);
  if (cVar2 != '\0') {
    booster::log::message::message
              (local_58,emergency,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x2b);
    poVar7 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Test",4);
    if (cVar2 != '\0') {
      booster::log::message::~message(local_58);
    }
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x2c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," called",7);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = std::__cxx11::string::compare((char *)&last_message_abi_cxx11_);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x2d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," last_message == \"Test\"",0x17);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_7a8 = local_798;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"test","");
  iVar4 = std::__cxx11::string::compare((char *)&local_7a8);
  if (local_7a8 != local_798) {
    operator_delete(local_7a8);
  }
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," last_module==std::string(\"test\")",0x21);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (last_level != emergency) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," last_level ==bl::emergency",0x1b);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0xa);
  if (cVar2 != '\0') {
    booster::log::message::message
              (local_88,alert,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x31);
    poVar7 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
    if (cVar2 != '\0') {
      booster::log::message::~message(local_88);
    }
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," called",7);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (last_level != alert) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," last_level==bl::alert",0x16);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
  if (cVar2 != '\0') {
    booster::log::message::message
              (local_b8,error,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x35);
    poVar7 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
    if (cVar2 != '\0') {
      booster::log::message::~message(local_b8);
    }
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x36);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," called",7);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (last_level != error) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x37);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," last_level==bl::error",0x16);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x28);
  if (cVar2 != '\0') {
    booster::log::message::message
              (local_e8,warning,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x39);
    poVar7 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
    if (cVar2 != '\0') {
      booster::log::message::~message(local_e8);
    }
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x3a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," !called",8);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
  if (cVar2 != '\0') {
    booster::log::message::message
              (local_118,notice,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x3c);
    poVar7 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
    if (cVar2 != '\0') {
      booster::log::message::~message(local_118);
    }
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x3d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," !called",8);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x46);
  if (cVar2 != '\0') {
    booster::log::message::message
              (local_148,debug,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x3f);
    poVar7 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
    if (cVar2 != '\0') {
      booster::log::message::~message(local_148);
    }
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," !called",8);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
  lVar3 = booster::log::logger::instance();
  booster::log::logger::set_default_level(lVar3);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
  if (cVar2 != '\0') {
    booster::log::message::message
              (local_178,notice,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x43);
    poVar7 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
    if (cVar2 != '\0') {
      booster::log::message::~message(local_178);
    }
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," called",7);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x3c);
  if (cVar2 != '\0') {
    booster::log::message::message
              (local_1a8,info,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x46);
    poVar7 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
    if (cVar2 != '\0') {
      booster::log::message::~message(local_1a8);
    }
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x47);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," !called",8);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
  lVar3 = booster::log::logger::instance();
  booster::log::logger::set_log_level(lVar3,(char *)0x1e);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
  if (cVar2 != '\0') {
    booster::log::message::message
              (local_1d8,error,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x4a);
    poVar7 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
    if (cVar2 != '\0') {
      booster::log::message::~message(local_1d8);
    }
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x4b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," called",7);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x28);
  if (cVar2 != '\0') {
    booster::log::message::message
              (local_208,warning,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x4d);
    poVar7 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
    if (cVar2 != '\0') {
      booster::log::message::~message(local_208);
    }
  }
  if (called != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x4e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," !called",8);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
  lVar3 = booster::log::logger::instance();
  booster::log::logger::set_log_level(lVar3,(char *)0x28);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x28);
  if (cVar2 != '\0') {
    booster::log::message::message
              (local_238,warning,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x51);
    poVar7 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
    if (cVar2 != '\0') {
      booster::log::message::~message(local_238);
    }
  }
  if (called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x52);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," called",7);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  called = false;
  last_module = "";
  last_level = all;
  std::__cxx11::string::_M_replace
            (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
  if (cVar2 != '\0') {
    booster::log::message::message
              (local_268,notice,"test",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x54);
    poVar7 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
    if (cVar2 != '\0') {
      booster::log::message::~message(local_268);
    }
  }
  if (called == false) {
    called = false;
    last_module = "";
    last_level = all;
    std::__cxx11::string::_M_replace
              (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
    pcVar8 = (char *)booster::log::logger::instance();
    booster::log::logger::reset_log_level(pcVar8);
    lVar3 = booster::log::logger::instance();
    cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x32);
    if (cVar2 != '\0') {
      booster::log::message::message
                (local_298,notice,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x58);
      poVar7 = (ostream *)booster::log::message::out();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
      if (cVar2 != '\0') {
        booster::log::message::~message(local_298);
      }
    }
    if (called == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x59);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," called",7);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,local_550);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    called = false;
    last_module = "";
    last_level = all;
    std::__cxx11::string::_M_replace
              (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
    lVar3 = booster::log::logger::instance();
    cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x3c);
    if (cVar2 != '\0') {
      booster::log::message::message
                (local_2c8,info,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x5b);
      poVar7 = (ostream *)booster::log::message::out();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
      if (cVar2 != '\0') {
        booster::log::message::~message(local_2c8);
      }
    }
    if (called != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x5c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," !called",8);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,local_550);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    called = false;
    last_module = "";
    last_level = all;
    std::__cxx11::string::_M_replace
              (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
    lVar3 = booster::log::logger::instance();
    cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x3c);
    if (cVar2 != '\0') {
      booster::log::message::message
                (local_2f8,info,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x5e);
      poVar7 = (ostream *)booster::log::message::out();
      never_called_called = true;
      std::ostream::operator<<(poVar7,10);
      if (cVar2 != '\0') {
        booster::log::message::~message(local_2f8);
      }
    }
    if (called != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x5f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," !called",8);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,local_550);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (never_called_called == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," !never_called_called",0x15);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,local_550);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    called = false;
    last_module = "";
    last_level = all;
    std::__cxx11::string::_M_replace
              (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
    pwVar9 = (weak_ptr *)booster::log::logger::instance();
    local_7a0 = local_7b0._M_pi;
    if (local_7b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_7b0._M_pi)->_M_weak_count = (local_7b0._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_7b0._M_pi)->_M_weak_count = (local_7b0._M_pi)->_M_weak_count + 1;
      }
    }
    local_7a8 = pfVar5;
    booster::log::logger::remove_sink(pwVar9);
    if (local_7a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &local_7a0->_M_weak_count;
        iVar4 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar4 = local_7a0->_M_weak_count;
        local_7a0->_M_weak_count = iVar4 + -1;
      }
      if (iVar4 == 1) {
        (*local_7a0->_vptr__Sp_counted_base[3])();
      }
    }
    lVar3 = booster::log::logger::instance();
    cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
    if (cVar2 != '\0') {
      booster::log::message::message
                (local_328,error,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,99);
      poVar7 = (ostream *)booster::log::message::out();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"message",7);
      if (cVar2 != '\0') {
        booster::log::message::~message(local_328);
      }
    }
    if (called != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,100);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," !called",8);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,local_550);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    called = false;
    last_module = "";
    last_level = all;
    std::__cxx11::string::_M_replace
              (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
    psVar6 = (shared_ptr *)booster::log::logger::instance();
    booster::log::logger::add_sink(psVar6);
    lVar3 = booster::log::logger::instance();
    cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
    if (cVar2 != '\0') {
      booster::log::message::message
                (local_358,error,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x67);
      poVar7 = (ostream *)booster::log::message::out();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"message",7);
      if (cVar2 != '\0') {
        booster::log::message::~message(local_358);
      }
    }
    if (called == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," called",7);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,local_550);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    called = false;
    last_module = "";
    last_level = all;
    std::__cxx11::string::_M_replace
              (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
    booster::log::logger::instance();
    booster::log::logger::remove_all_sinks();
    lVar3 = booster::log::logger::instance();
    cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
    if (cVar2 != '\0') {
      booster::log::message::message
                (local_388,error,"test",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6b);
      poVar7 = (ostream *)booster::log::message::out();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"message",7);
      if (cVar2 != '\0') {
        booster::log::message::~message(local_388);
      }
    }
    if (called == false) {
      called = false;
      last_module = "";
      last_level = all;
      std::__cxx11::string::_M_replace
                (0x10b1f0,0,(char *)last_message_abi_cxx11_._M_string_length,0x108010);
      pfVar5 = (file *)operator_new(0x30);
      booster::log::sinks::file::file(pfVar5);
      local_5a0 = pfVar5;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<booster::log::sinks::file*>
                (&local_598,pfVar5);
      pfVar5 = local_5a0;
      local_3d8[0] = local_3c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"test.log","");
      booster::log::sinks::file::open(pfVar5,local_3d8);
      if (local_3d8[0] != local_3c8) {
        operator_delete(local_3d8[0]);
      }
      psVar6 = (shared_ptr *)booster::log::logger::instance();
      local_7a8 = local_5a0;
      local_7a0 = local_598._M_pi;
      if (local_598._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_598._M_pi)->_M_use_count = (local_598._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_598._M_pi)->_M_use_count = (local_598._M_pi)->_M_use_count + 1;
        }
      }
      booster::log::logger::add_sink(psVar6);
      if (local_7a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7a0);
      }
      lVar3 = booster::log::logger::instance();
      cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
      if (cVar2 != '\0') {
        booster::log::message::message
                  (local_3b8,error,"module",
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                   ,0x72);
        poVar7 = (ostream *)booster::log::message::out();
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Message ",8);
        std::ostream::_M_insert<double>(3.14159);
        if (cVar2 != '\0') {
          booster::log::message::~message(local_3b8);
        }
      }
      std::ifstream::ifstream(&local_7a8,"test.log",_S_in);
      if (*(int *)((long)aiStack_788 + *(long *)(local_7a8 + -0x18)) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_550);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_550,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                   ,0x6a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_550,0x74);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ifs.good()",0xb);
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar11,(string *)&local_590);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_588 = 0;
      local_580[0] = 0;
      local_590 = local_580;
      cVar2 = std::ios::widen((char)&local_7a8 + (char)*(undefined8 *)(local_7a8 + -0x18));
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_7a8,(string *)&local_590,cVar2);
      lVar10 = std::__cxx11::string::find((char *)&local_590,0x10815b,0);
      if (lVar10 == -1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_550);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_550,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                   ,0x6a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_550,0x77);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," line.find(\"Message \")!=std::string::npos",0x29);
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar11,local_570);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar10 = std::__cxx11::string::find((char *)&local_590,0x108154,0);
      if (lVar10 != -1) {
        lVar10 = std::__cxx11::string::find((char *)&local_590,0x1081c2,0);
        if (lVar10 != -1) {
          if (local_590 != local_580) {
            operator_delete(local_590);
          }
          std::ifstream::~ifstream(&local_7a8);
          if (local_598._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_598._M_pi);
          }
          if (local_7b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7b0._M_pi);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
          std::ostream::put('(');
          std::ostream::flush();
          return 0;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_550);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_550,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                   ,0x6a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_550,0x79);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," line.find(\"3.14159\")!=std::string::npos",0x28);
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar11,local_570);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_550);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_550,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_550,0x78);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," line.find(\"module\")!=std::string::npos",0x27);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,local_570);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_7a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," !called",8);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,local_550);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_7a8,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/log/test/test_log.cpp"
             ,0x6a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_7a8,":",1);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_7a8,0x55);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," !called",8);
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar11,local_550);
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		namespace bl = booster::log;
		booster::shared_ptr<bl::sink> s(new my_sink);
		bl::logger::instance().add_sink(s);
		reset();
		BOOSTER_EMERG("test") << "Test";
		TEST(called);
		TEST(last_message == "Test");
		TEST(last_module==std::string("test"));
		TEST(last_level ==bl::emergency);
		reset();
		BOOSTER_ALERT("test") << "x";
		TEST(called);
		TEST(last_level==bl::alert);
		reset();
		BOOSTER_ERROR("test") << "x";
		TEST(called);
		TEST(last_level==bl::error);
		reset();
		BOOSTER_WARNING("test") << "x";
		TEST(!called);
		reset();
		BOOSTER_NOTICE("test") << "x";
		TEST(!called);
		reset();
		BOOSTER_DEBUG("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().set_default_level(bl::notice);
		BOOSTER_NOTICE("test") << "x";
		TEST(called);
		reset();
		BOOSTER_INFO("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().set_log_level(bl::error,"test");
		BOOSTER_ERROR("test") << "x";
		TEST(called);
		reset();
		BOOSTER_WARNING("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().set_log_level(bl::warning,"test");
		BOOSTER_WARNING("test") << "x";
		TEST(called);
		reset();
		BOOSTER_NOTICE("test") << "x";
		TEST(!called);
		reset();
		bl::logger::instance().reset_log_level("test");
		BOOSTER_NOTICE("test") << "x";
		TEST(called);
		reset();
		BOOSTER_INFO("test") << "x";
		TEST(!called);
		reset();
		BOOSTER_INFO("test") << never_called();
		TEST(!called);
		TEST(!never_called_called);
		reset();
		bl::logger::instance().remove_sink(s);
		BOOSTER_ERROR("test") << "message";
		TEST(!called);
		reset();
		bl::logger::instance().add_sink(s);
		BOOSTER_ERROR("test") << "message";
		TEST(called);
		reset();
		bl::logger::instance().remove_all_sinks();
		BOOSTER_ERROR("test") << "message";
		TEST(!called);
		reset();

		booster::shared_ptr<bl::sinks::file> f(new bl::sinks::file());
		f->open("test.log");
		bl::logger::instance().add_sink(f);
		BOOSTER_ERROR("module") << "Message " << 3.14159;
		std::ifstream ifs("test.log");
		TEST(ifs.good());
		std::string line;
		std::getline(ifs,line);
		TEST(line.find("Message ")!=std::string::npos);
		TEST(line.find("module")!=std::string::npos);
		TEST(line.find("3.14159")!=std::string::npos);
	}
	catch(std::exception const &e)
	{
		std::cerr << "Fail: " <<e.what() << std::endl;
		return 1;
	}
	
	std::cout << "Ok" << std::endl;

	return 0;
}